

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Vec_Int_t * Abc_NtkAssignStarts(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,int *pnTotal)

{
  Vec_Int_t *p;
  void *pvVar1;
  int iVar2;
  int Entry;
  int i;
  
  p = Vec_IntStart(pNtk->nObjs);
  Entry = 0;
  for (i = 0; i < vNodes->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vNodes,i);
    Vec_IntWriteEntry(p,*(int *)((long)pvVar1 + 0x40),Entry);
    iVar2 = 1 << ((char)*(int *)((long)pvVar1 + 0x1c) - 6U & 0x1f);
    if (*(int *)((long)pvVar1 + 0x1c) < 7) {
      iVar2 = 1;
    }
    Entry = Entry + iVar2;
  }
  *pnTotal = Entry;
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkAssignStarts( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, int * pnTotal )
{
    Abc_Obj_t * pObj; int i, Counter = 0;
    Vec_Int_t * vStarts = Vec_IntStart( Abc_NtkObjNum(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntWriteEntry( vStarts, pObj->iTemp, Counter );
        Counter += Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
    }
    *pnTotal = Counter;
    return vStarts;
}